

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void av1_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  transform_1d_avx2_conflict2 p_Var2;
  int8_t *piVar3;
  undefined7 in_register_00000009;
  long lVar4;
  __m256i *palVar5;
  ulong uVar6;
  __m256i *palVar7;
  longlong *plVar8;
  __m256i buf1 [128];
  __m256i buf0 [128];
  longlong local_2060 [4];
  longlong local_2040 [508];
  longlong local_1060 [518];
  
  piVar3 = av1_fwd_txfm_shift_ls[3];
  p_Var2 = col_txfm8x32_arr[CONCAT71(in_register_00000009,tx_type) & 0xffffffff];
  palVar5 = (__m256i *)local_1060;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x20) {
    load_buffer_16xn_avx2((int16_t *)((long)input + lVar4),palVar5,stride,0x20,4,0,0);
    cVar1 = *piVar3;
    round_shift_32_8xn_avx2(palVar5,0x20,(int)cVar1,4);
    palVar7 = palVar5 + 1;
    round_shift_32_8xn_avx2(palVar7,0x20,(int)cVar1,4);
    (*p_Var2)(palVar5,palVar5,'\f',4,4);
    (*p_Var2)(palVar7,palVar7,'\f',4,4);
    cVar1 = piVar3[1];
    round_shift_32_8xn_avx2(palVar5,0x20,(int)cVar1,4);
    round_shift_32_8xn_avx2(palVar7,0x20,(int)cVar1,4);
    palVar5 = palVar5 + 2;
  }
  plVar8 = local_1060;
  palVar5 = &local_2060;
  for (uVar6 = 0; uVar6 < 0x20; uVar6 = uVar6 + 8) {
    palVar7 = palVar5;
    for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 0x20) {
      fwd_txfm_transpose_8x8_avx2((__m256i *)((long)plVar8 + lVar4),palVar7,4,4);
      palVar7 = palVar7 + 0x20;
    }
    plVar8 = plVar8 + 0x80;
    palVar5 = palVar5 + 1;
  }
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 0x40) {
    palVar7 = (__m256i *)((long)local_2060 + lVar4);
    (*p_Var2)(palVar7,palVar7,'\f',4,4);
    palVar5 = (__m256i *)((long)local_2040 + lVar4);
    (*p_Var2)(palVar5,palVar5,'\f',4,4);
    cVar1 = piVar3[2];
    round_shift_32_8xn_avx2(palVar7,0x20,(int)cVar1,4);
    round_shift_32_8xn_avx2(palVar5,0x20,(int)cVar1,4);
  }
  store_buffer_avx2(&local_2060,output,0x80,0x80);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[128], buf1[128];
  const int tx_size = TX_32X32;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x32_arr[tx_type];
  int r, c;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[(i << 1)], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[(i << 1)], &buf0[(i << 1)], cos_bit_col, width_div8,
             width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < width_div16; i++) {
    row_txfm(&buf1[(i << 1)], &buf1[(i << 1)], cos_bit_row, width_div8,
             width_div8);
    row_txfm(&buf1[(i << 1) + 1], &buf1[(i << 1) + 1], cos_bit_row, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1)], height, shift[2], width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1) + 1], height, shift[2], width_div8);
  }

  store_buffer_avx2(buf1, output, 8, 128);
}